

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm1d.c
# Opt level: O3

void av1_idct4(int32_t *input,int32_t *output,int8_t cos_bit,int8_t *stage_range)

{
  long lVar1;
  long lVar2;
  undefined7 in_register_00000011;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int32_t step [4];
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  
  lVar4 = (long)(int)CONCAT71(in_register_00000011,cos_bit) * 0x100;
  *output = *input;
  output[1] = input[2];
  output[2] = input[1];
  output[3] = input[3];
  av1_range_check_buf(1,input,output,4,stage_range[1]);
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1e0);
  iVar5 = output[1] * iVar6;
  lVar2 = 1L << (cos_bit - 1U & 0x3f);
  lVar3 = (long)*output * (long)iVar6 + lVar2;
  local_48 = (int)(lVar3 + iVar5 >> (cos_bit & 0x3fU));
  local_44 = (int)(-iVar5 + lVar3 >> (cos_bit & 0x3fU));
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x1a0);
  iVar5 = *(int *)((long)vert_filter_length_chroma + lVar4 + 0x220);
  local_40 = (int)(output[2] * iVar5 + lVar2 + (long)-(iVar6 * output[3]) >> (cos_bit & 0x3fU));
  local_3c = (int)(iVar6 * output[2] + lVar2 + (long)(output[3] * iVar5) >> (cos_bit & 0x3fU));
  av1_range_check_buf(2,input,&local_48,4,stage_range[2]);
  iVar6 = local_3c + local_48;
  if ('\0' < stage_range[3]) {
    lVar4 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar3 = (long)iVar6;
    lVar2 = lVar4 + -1;
    if (lVar3 < lVar4 + -1) {
      lVar2 = lVar3;
    }
    lVar1 = -lVar4;
    if (SBORROW8(lVar3,-lVar4) == lVar3 + lVar4 < 0) {
      lVar1 = lVar2;
    }
    iVar6 = (int)lVar1;
  }
  *output = iVar6;
  iVar6 = local_40 + local_44;
  if ('\0' < stage_range[3]) {
    lVar3 = (long)iVar6;
    lVar4 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar2 = lVar4 + -1;
    if (lVar3 < lVar4 + -1) {
      lVar2 = lVar3;
    }
    lVar1 = -lVar4;
    if (SBORROW8(lVar3,-lVar4) == lVar3 + lVar4 < 0) {
      lVar1 = lVar2;
    }
    iVar6 = (int)lVar1;
  }
  output[1] = iVar6;
  local_44 = local_44 - local_40;
  if ('\0' < stage_range[3]) {
    lVar3 = (long)local_44;
    lVar4 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar2 = lVar4 + -1;
    if (lVar3 < lVar4 + -1) {
      lVar2 = lVar3;
    }
    lVar1 = -lVar4;
    if (SBORROW8(lVar3,-lVar4) == lVar3 + lVar4 < 0) {
      lVar1 = lVar2;
    }
    local_44 = (int)lVar1;
  }
  output[2] = local_44;
  local_48 = local_48 - local_3c;
  if ('\0' < stage_range[3]) {
    lVar3 = (long)local_48;
    lVar4 = 1L << (stage_range[3] - 1U & 0x3f);
    lVar2 = lVar4 + -1;
    if (lVar3 < lVar4 + -1) {
      lVar2 = lVar3;
    }
    lVar1 = -lVar4;
    if (SBORROW8(lVar3,-lVar4) == lVar3 + lVar4 < 0) {
      lVar1 = lVar2;
    }
    local_48 = (int)lVar1;
  }
  output[3] = local_48;
  return;
}

Assistant:

void av1_idct4(const int32_t *input, int32_t *output, int8_t cos_bit,
               const int8_t *stage_range) {
  assert(output != input);
  const int32_t size = 4;
  const int32_t *cospi = cospi_arr(cos_bit);

  int32_t stage = 0;
  int32_t *bf0, *bf1;
  int32_t step[4];

  // stage 0;

  // stage 1;
  stage++;
  bf1 = output;
  bf1[0] = input[0];
  bf1[1] = input[2];
  bf1[2] = input[1];
  bf1[3] = input[3];
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 2
  stage++;
  bf0 = output;
  bf1 = step;
  bf1[0] = half_btf(cospi[32], bf0[0], cospi[32], bf0[1], cos_bit);
  bf1[1] = half_btf(cospi[32], bf0[0], -cospi[32], bf0[1], cos_bit);
  bf1[2] = half_btf(cospi[48], bf0[2], -cospi[16], bf0[3], cos_bit);
  bf1[3] = half_btf(cospi[16], bf0[2], cospi[48], bf0[3], cos_bit);
  av1_range_check_buf(stage, input, bf1, size, stage_range[stage]);

  // stage 3
  stage++;
  bf0 = step;
  bf1 = output;
  bf1[0] = clamp_value(bf0[0] + bf0[3], stage_range[stage]);
  bf1[1] = clamp_value(bf0[1] + bf0[2], stage_range[stage]);
  bf1[2] = clamp_value(bf0[1] - bf0[2], stage_range[stage]);
  bf1[3] = clamp_value(bf0[0] - bf0[3], stage_range[stage]);
}